

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

void __thiscall
kj::StringTree::fill<kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>>
          (StringTree *this,char *pos,size_t branchIndex,String *first,ArrayPtr<const_char> *rest,
          String *rest_1,ArrayPtr<const_char> *rest_2)

{
  size_t sVar1;
  ArrayDisposer *pAVar2;
  Branch *pBVar3;
  char *pcVar4;
  size_t sVar5;
  ArrayDisposer *pAVar6;
  Branch *pBVar7;
  size_t __n;
  char *pcVar8;
  size_t sVar9;
  
  pcVar8 = (char *)(this->text).content.size_;
  if (pcVar8 != (char *)0x0) {
    pcVar8 = (this->text).content.ptr;
  }
  (this->branches).ptr[branchIndex].index = (long)pos - (long)pcVar8;
  sVar1 = (first->content).size_;
  sVar9 = 0;
  if (sVar1 != 0) {
    sVar9 = sVar1 - 1;
  }
  pcVar8 = (first->content).ptr;
  pAVar2 = (first->content).disposer;
  (first->content).ptr = (char *)0x0;
  (first->content).size_ = 0;
  pBVar3 = (this->branches).ptr;
  pBVar3[branchIndex].content.size_ = sVar9;
  pcVar4 = pBVar3[branchIndex].content.text.content.ptr;
  if (pcVar4 != (char *)0x0) {
    sVar5 = pBVar3[branchIndex].content.text.content.size_;
    pBVar3[branchIndex].content.text.content.ptr = (char *)0x0;
    pBVar3[branchIndex].content.text.content.size_ = 0;
    pAVar6 = pBVar3[branchIndex].content.text.content.disposer;
    (**pAVar6->_vptr_ArrayDisposer)(pAVar6,pcVar4,1,sVar5,sVar5,0,rest_2,rest_1,sVar9);
  }
  pBVar3[branchIndex].content.text.content.ptr = pcVar8;
  pBVar3[branchIndex].content.text.content.size_ = sVar1;
  pBVar3[branchIndex].content.text.content.disposer = pAVar2;
  pBVar7 = pBVar3[branchIndex].content.branches.ptr;
  if (pBVar7 != (Branch *)0x0) {
    sVar1 = pBVar3[branchIndex].content.branches.size_;
    pBVar3[branchIndex].content.branches.ptr = (Branch *)0x0;
    pBVar3[branchIndex].content.branches.size_ = 0;
    pAVar2 = pBVar3[branchIndex].content.branches.disposer;
    (**pAVar2->_vptr_ArrayDisposer)
              (pAVar2,pBVar7,0x40,sVar1,sVar1,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  pBVar3[branchIndex].content.branches.ptr = (Branch *)0x0;
  pBVar3[branchIndex].content.branches.size_ = 0;
  pBVar3[branchIndex].content.branches.disposer = (ArrayDisposer *)0x0;
  __n = rest->size_;
  if (__n != 0) {
    memcpy(pos,rest->ptr,__n);
    pos = pos + __n;
  }
  fill<kj::ArrayPtr<char_const>>(this,pos,branchIndex + 1,rest_1,rest_2);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, String&& first, Rest&&... rest) {
  branches[branchIndex].index = pos - text.begin();
  branches[branchIndex].content = StringTree(kj::mv(first));
  fill(pos, branchIndex + 1, kj::fwd<Rest>(rest)...);
}